

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

char_t * pugi::impl::anon_unknown_0::namespace_uri(xml_attribute attr,xml_node parent)

{
  namespace_uri_predicate pred_00;
  unspecified_bool_type p_Var1;
  unspecified_bool_type p_Var2;
  char_t *pcVar3;
  xml_attribute a;
  xml_node p;
  namespace_uri_predicate pred;
  xml_node *in_stack_ffffffffffffffa8;
  xml_attribute in_stack_ffffffffffffffc8;
  xml_node in_stack_ffffffffffffffd0;
  xml_node *local_28;
  char_t *local_20;
  xml_attribute local_10;
  char *local_8;
  
  xml_attribute::name(&local_10);
  namespace_uri_predicate::namespace_uri_predicate
            ((namespace_uri_predicate *)in_stack_ffffffffffffffd0._root,
             (char_t *)in_stack_ffffffffffffffc8._attr);
  if (local_28 != (xml_node *)0x0) {
    while (p_Var1 = xml_node::operator_cast_to_function_pointer
                              ((xml_node *)&stack0xffffffffffffffd0),
          p_Var1 != (unspecified_bool_type)0x0) {
      pred_00.prefix_length = (size_t)in_stack_ffffffffffffffc8._attr;
      pred_00.prefix = local_20;
      in_stack_ffffffffffffffc8 =
           xml_node::find_attribute<pugi::impl::(anonymous_namespace)::namespace_uri_predicate>
                     (local_28,pred_00);
      p_Var2 = xml_attribute::operator_cast_to_function_pointer
                         ((xml_attribute *)&stack0xffffffffffffffc8);
      if (p_Var2 != (unspecified_bool_type)0x0) {
        pcVar3 = xml_attribute::value((xml_attribute *)&stack0xffffffffffffffc8);
        return pcVar3;
      }
      xml_node::parent(in_stack_ffffffffffffffa8);
    }
  }
  local_8 = "";
  return local_8;
}

Assistant:

PUGI__FN const char_t* namespace_uri(xml_attribute attr, xml_node parent)
	{
		namespace_uri_predicate pred = attr.name();

		// Default namespace does not apply to attributes
		if (!pred.prefix) return PUGIXML_TEXT("");

		xml_node p = parent;

		while (p)
		{
			xml_attribute a = p.find_attribute(pred);

			if (a) return a.value();

			p = p.parent();
		}

		return PUGIXML_TEXT("");
	}